

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Chooser2.cxx
# Opt level: O1

void __thiscall Fl_File_Chooser::remove_hidden_files(Fl_File_Chooser *this)

{
  bool bVar1;
  int iVar2;
  char *__s1;
  uint line;
  
  line = (this->fileList->super_Fl_Browser).lines;
  if (0 < (int)line) {
    do {
      __s1 = Fl_Browser::text(&this->fileList->super_Fl_Browser,line);
      if ((*__s1 == '.') && (iVar2 = strcmp(__s1,"../"), iVar2 != 0)) {
        Fl_Browser::remove(&this->fileList->super_Fl_Browser,(char *)(ulong)line);
      }
      bVar1 = 1 < (int)line;
      line = line - 1;
    } while (bVar1);
  }
  Fl_Browser::lineposition(&this->fileList->super_Fl_Browser,1,TOP);
  return;
}

Assistant:

void Fl_File_Chooser::remove_hidden_files()
{
  int count = fileList->size();
  for(int num = count; num >= 1; num--) {
    const char *p = fileList->text(num);
    if (*p == '.' && strcmp(p, "../") != 0) fileList->remove(num);
  }
  fileList->topline(1);
}